

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

object * __thiscall pybind11::object::operator=(object *this,object *other)

{
  handle temp;
  handle local_10;
  
  if (this != other) {
    local_10.m_ptr = (this->super_handle).m_ptr;
    (this->super_handle).m_ptr = (other->super_handle).m_ptr;
    (other->super_handle).m_ptr = (PyObject *)0x0;
    handle::dec_ref(&local_10);
  }
  return this;
}

Assistant:

object &operator=(object &&other) noexcept {
        if (this != &other) {
            handle temp(m_ptr);
            m_ptr = other.m_ptr;
            other.m_ptr = nullptr;
            temp.dec_ref();
        }
        return *this;
    }